

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeHalt(Vdbe *p)

{
  byte *pbVar1;
  uint uVar2;
  yDbMask yVar3;
  sqlite3 *db;
  VdbeFrame *pVVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  VdbeFrame *pFrame;
  int iVar9;
  long lVar10;
  VdbeFrame *pDel;
  
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar4 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar4;
      pVVar4 = pFrame->pParent;
    } while (pVVar4 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  releaseMemArray(p->aMem,p->nMem);
  while (pVVar4 = p->pDelFrame, pVVar4 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar4->pParent;
    if (0 < pVVar4->nChildCsr) {
      iVar9 = pVVar4->nChildMem;
      lVar10 = 0;
      do {
        if ((&pVVar4[1].v)[(long)iVar9 * 7 + lVar10] != (Vdbe *)0x0) {
          sqlite3VdbeFreeCursorNN(pVVar4->v,(VdbeCursor *)(&pVVar4[1].v)[(long)iVar9 * 7 + lVar10]);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar4->nChildCsr);
    }
    releaseMemArray((Mem *)(pVVar4 + 1),pVVar4->nChildMem);
    sqlite3VdbeDeleteAuxData(pVVar4->v->db,&pVVar4->pAuxData,-1,0);
    sqlite3DbFreeNN(pVVar4->v->db,pVVar4);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  if (-1 < (char)p->field_0xc6) goto LAB_00153a4c;
  sqlite3VdbeEnter(p);
  uVar2 = p->rc;
  if (uVar2 == 0) {
    uVar7 = 0;
LAB_001537a3:
    bVar6 = false;
  }
  else {
    uVar7 = uVar2 & 0xff;
    if ((0xd < (byte)uVar2) || (bVar6 = true, (0x2680U >> (uVar2 & 0x1f) & 1) == 0))
    goto LAB_001537a3;
  }
  bVar5 = true;
  iVar9 = 0;
  if ((bVar6) && (iVar9 = 0, (uVar7 == 9 & (p->field_0xc6 & 0x40) >> 6) == 0)) {
    if (((uVar7 == 0xd) || (uVar7 == 7)) && ((p->field_0xc6 & 0x20) != 0)) {
      iVar9 = 2;
      bVar5 = false;
    }
    else {
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      db->autoCommit = '\x01';
      p->nChange = 0;
    }
  }
  if (((p->rc == 0) || (p->errorAction == '\x03' && !bVar6)) && (0 < p->nFkConstraint)) {
    p->rc = 0x313;
    p->errorAction = '\x02';
    sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
  }
  if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
     ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc6 & 0x40) == 0))))) {
    if ((p->rc != 0) && (bVar6 || p->errorAction != '\x03')) {
LAB_00153954:
      sqlite3RollbackAll(db,0);
      p->nChange = 0;
LAB_0015397d:
      db->nStatement = 0;
      goto LAB_00153988;
    }
    iVar8 = sqlite3VdbeCheckFk(p,1);
    if (iVar8 == 0) {
      if ((db->flags >> 0x21 & 1) == 0) {
        iVar8 = vdbeCommit(db,p);
      }
      else {
        db->flags = db->flags & 0xfffffffdffffffff;
        iVar8 = 0xb;
      }
LAB_00153937:
      if (iVar8 == 0) {
        db->nDeferredCons = 0;
        db->nDeferredImmCons = 0;
        pbVar1 = (byte *)((long)&db->flags + 2);
        *pbVar1 = *pbVar1 & 0xf7;
        *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfe;
        goto LAB_0015397d;
      }
      if ((iVar8 != 5) || ((p->field_0xc6 & 0x40) == 0)) {
        p->rc = iVar8;
        goto LAB_00153954;
      }
      iVar9 = 5;
    }
    else {
      iVar8 = 0x313;
      if ((p->field_0xc6 & 0x40) == 0) goto LAB_00153937;
      iVar9 = 1;
    }
    bVar6 = false;
    yVar3 = p->lockMask;
  }
  else {
    if (((bVar5) && (iVar9 = 1, p->rc != 0)) && (p->errorAction != '\x03')) {
      if (p->errorAction == '\x02') {
        iVar9 = 2;
      }
      else {
        sqlite3RollbackAll(db,0x204);
        sqlite3CloseSavepoints(db);
        db->autoCommit = '\x01';
        p->nChange = 0;
        iVar9 = 0;
      }
    }
LAB_00153988:
    if (iVar9 != 0) {
      iVar8 = 0;
      if ((p->db->nStatement != 0) && (p->iStatement != 0)) {
        iVar8 = vdbeCloseStatement(p,iVar9);
      }
      if (iVar8 != 0) {
        if (p->rc == 0 || (char)p->rc == '\x13') {
          p->rc = iVar8;
          if (p->zErrMsg != (char *)0x0) {
            sqlite3DbFreeNN(db,p->zErrMsg);
          }
          p->zErrMsg = (char *)0x0;
        }
        sqlite3RollbackAll(db,0x204);
        sqlite3CloseSavepoints(db);
        db->autoCommit = '\x01';
        p->nChange = 0;
      }
    }
    if ((p->field_0xc6 & 0x10) != 0) {
      if (iVar9 == 2) {
        db->nChange = 0;
      }
      else {
        lVar10 = p->nChange;
        db->nChange = lVar10;
        db->nTotalChange = db->nTotalChange + lVar10;
      }
      p->nChange = 0;
    }
    bVar6 = true;
    yVar3 = p->lockMask;
  }
  if (yVar3 != 0) {
    vdbeLeave(p);
  }
  if (!bVar6) {
    return iVar9;
  }
LAB_00153a4c:
  db->nVdbeActive = db->nVdbeActive + -1;
  if ((p->field_0xc6 & 0x40) == 0) {
    db->nVdbeWrite = db->nVdbeWrite + -1;
  }
  if ((char)p->field_0xc6 < '\0') {
    db->nVdbeRead = db->nVdbeRead + -1;
  }
  p->eVdbeState = '\x03';
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  return (uint)(p->rc == 5) * 5;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine.
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  assert( p->eVdbeState==VDBE_RUN_STATE );
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    if( p->rc ){
      mrc = p->rc & 0xff;
      isSpecialError = mrc==SQLITE_NOMEM
                    || mrc==SQLITE_IOERR
                    || mrc==SQLITE_INTERRUPT
                    || mrc==SQLITE_FULL;
    }else{
      mrc = isSpecialError = 0;
    }
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT,
      ** no rollback is necessary. Otherwise, at least a savepoint
      ** transaction must be rolled back to restore the database to a
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
      sqlite3VdbeCheckFk(p, 0);
    }

    /* If the auto-commit flag is set and this is the only active writer
    ** VM, then we do either a commit or rollback of the current transaction.
    **
    ** Note: This block also runs if one of the special errors handled
    ** above has occurred.
    */
    if( !sqlite3VtabInSync(db)
     && db->autoCommit
     && db->nVdbeWrite==(p->readOnly==0)
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else if( db->flags & SQLITE_CorruptRdOnly ){
          rc = SQLITE_CORRUPT;
          db->flags &= ~SQLITE_CorruptRdOnly;
        }else{
          /* The auto-commit flag is true, the vdbe program was successful
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~(u64)SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter.
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  db->nVdbeActive--;
  if( !p->readOnly ) db->nVdbeWrite--;
  if( p->bIsReader ) db->nVdbeRead--;
  assert( db->nVdbeActive>=db->nVdbeRead );
  assert( db->nVdbeRead>=db->nVdbeWrite );
  assert( db->nVdbeWrite>=0 );
  p->eVdbeState = VDBE_HALT_STATE;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked()
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}